

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_indset.cpp
# Opt level: O1

Read<signed_char> __thiscall
Omega_h::find_indset
          (Omega_h *this,Mesh *mesh,Int ent_dim,Graph *graph,Reals *quality,
          Read<signed_char> *candidates)

{
  int *piVar1;
  void *pvVar2;
  void *pvVar3;
  Alloc *pAVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  Read<signed_char> RVar6;
  QualityCompare compare;
  LOs adj;
  LOs xadj;
  Alloc *local_c8;
  Alloc *local_b8;
  Alloc *local_a8;
  Alloc *local_98;
  Read<signed_char> local_88;
  LOs local_78;
  LOs local_68;
  QualityCompare local_58;
  Alloc *local_38;
  element_type *local_30;
  void *pvVar5;
  
  local_98 = (graph->a2ab).write_.shared_alloc_.alloc;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)(local_98->size * 8 + 1);
    }
    else {
      local_98->use_count = local_98->use_count + 1;
    }
  }
  pvVar5 = (graph->a2ab).write_.shared_alloc_.direct_ptr;
  local_a8 = (graph->ab2b).write_.shared_alloc_.alloc;
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8 = (Alloc *)(local_a8->size * 8 + 1);
    }
    else {
      local_a8->use_count = local_a8->use_count + 1;
    }
  }
  pvVar2 = (graph->ab2b).write_.shared_alloc_.direct_ptr;
  local_c8 = (quality->write_).shared_alloc_.alloc;
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)(local_c8->size * 8 + 1);
    }
    else {
      local_c8->use_count = local_c8->use_count + 1;
    }
  }
  pvVar3 = (quality->write_).shared_alloc_.direct_ptr;
  Mesh::globals((Mesh *)&local_38,(Int)mesh);
  local_b8 = local_38;
  if ((((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    local_38->use_count = local_38->use_count + -1;
    local_b8 = (Alloc *)(local_38->size * 8 + 1);
  }
  local_68.write_.shared_alloc_.alloc = local_98;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68.write_.shared_alloc_.alloc = (Alloc *)(local_98->size * 8 + 1);
    }
    else {
      local_98->use_count = local_98->use_count + 1;
    }
  }
  local_78.write_.shared_alloc_.alloc = local_a8;
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_78.write_.shared_alloc_.alloc = (Alloc *)(local_a8->size * 8 + 1);
    }
    else {
      local_a8->use_count = local_a8->use_count + 1;
    }
  }
  local_88.write_.shared_alloc_.alloc = (candidates->write_).shared_alloc_.alloc;
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.write_.shared_alloc_.alloc =
           (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_88.write_.shared_alloc_.alloc)->use_count =
           (local_88.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_88.write_.shared_alloc_.direct_ptr = (candidates->write_).shared_alloc_.direct_ptr;
  local_58.quality.write_.shared_alloc_.alloc = local_c8;
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.quality.write_.shared_alloc_.alloc = (Alloc *)(local_c8->size * 8 + 1);
    }
    else {
      local_c8->use_count = local_c8->use_count + 1;
    }
  }
  local_58.global.write_.shared_alloc_.alloc = local_b8;
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.global.write_.shared_alloc_.alloc = (Alloc *)(local_b8->size * 8 + 1);
    }
    else {
      local_b8->use_count = local_b8->use_count + 1;
    }
  }
  local_58.global.write_.shared_alloc_.direct_ptr = local_30;
  local_78.write_.shared_alloc_.direct_ptr = pvVar2;
  local_68.write_.shared_alloc_.direct_ptr = pvVar5;
  local_58.quality.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar6 = indset::find<Omega_h::QualityCompare>
                    ((indset *)this,mesh,ent_dim,&local_68,&local_78,&local_88,&local_58);
  pAVar4 = local_58.global.write_.shared_alloc_.alloc;
  pvVar5 = RVar6.write_.shared_alloc_.direct_ptr;
  if (((ulong)local_58.global.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.global.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_58.global.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58.global.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
      pvVar5 = extraout_RDX;
    }
  }
  pAVar4 = local_58.quality.write_.shared_alloc_.alloc;
  if (((ulong)local_58.quality.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.quality.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_58.quality.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58.quality.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
      pvVar5 = extraout_RDX_00;
    }
  }
  pAVar4 = local_88.write_.shared_alloc_.alloc;
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
      pvVar5 = extraout_RDX_01;
    }
  }
  pAVar4 = local_78.write_.shared_alloc_.alloc;
  if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
      local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_78.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
      pvVar5 = extraout_RDX_02;
    }
  }
  pAVar4 = local_68.write_.shared_alloc_.alloc;
  if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
      local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
      pvVar5 = extraout_RDX_03;
    }
  }
  if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
    piVar1 = &local_b8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b8);
      operator_delete(local_b8,0x48);
      pvVar5 = extraout_RDX_04;
    }
  }
  if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
    piVar1 = &local_c8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_c8);
      operator_delete(local_c8,0x48);
      pvVar5 = extraout_RDX_05;
    }
  }
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    piVar1 = &local_a8->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a8);
      operator_delete(local_a8,0x48);
      pvVar5 = extraout_RDX_06;
    }
  }
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    piVar1 = &local_98->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98);
      operator_delete(local_98,0x48);
      pvVar5 = extraout_RDX_07;
    }
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar6.write_.shared_alloc_;
}

Assistant:

Read<I8> find_indset(
    Mesh* mesh, Int ent_dim, Graph graph, Reals quality, Read<I8> candidates) {
  auto xadj = graph.a2ab;
  auto adj = graph.ab2b;
  QualityCompare compare;
  compare.quality = quality;
  compare.global = mesh->globals(ent_dim);
  return indset::find(mesh, ent_dim, xadj, adj, candidates, compare);
}